

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError IsFormatSupported(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *inputParameters,
                         PaStreamParameters *outputParameters,double sampleRate)

{
  int iVar1;
  PaError PVar2;
  StreamDirection streamDir;
  char *format;
  bool bVar3;
  
  if (inputParameters == (PaStreamParameters *)0x0) {
    bVar3 = true;
    if (outputParameters == (PaStreamParameters *)0x0) {
      return 0;
    }
  }
  else {
    paUtilErr_ = ValidateParameters(inputParameters,hostApi,StreamDirection_In);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1837\n"
      ;
      goto LAB_0010e155;
    }
    bVar3 = inputParameters->channelCount == 0;
    if (outputParameters == (PaStreamParameters *)0x0) {
      if (inputParameters->channelCount == 0) {
        return 0;
      }
      streamDir = StreamDirection_In;
      goto LAB_0010e136;
    }
  }
  paUtilErr_ = ValidateParameters(outputParameters,hostApi,StreamDirection_Out);
  if (-1 < paUtilErr_) {
    iVar1 = outputParameters->channelCount;
    if (bVar3) {
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      PVar2 = TestParameters(hostApi,inputParameters,sampleRate,StreamDirection_In);
      if (PVar2 != 0 || iVar1 == 0) {
        return PVar2;
      }
    }
    streamDir = StreamDirection_Out;
    inputParameters = outputParameters;
LAB_0010e136:
    PVar2 = TestParameters(hostApi,inputParameters,sampleRate,streamDir);
    return PVar2;
  }
  format = 
  "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1845\n"
  ;
LAB_0010e155:
  PaUtil_DebugPrint(format);
  return paUtilErr_;
}

Assistant:

static PaError IsFormatSupported( struct PaUtilHostApiRepresentation *hostApi,
                                  const PaStreamParameters *inputParameters,
                                  const PaStreamParameters *outputParameters,
                                  double sampleRate )
{
    int inputChannelCount = 0, outputChannelCount = 0;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    PaError result = paFormatIsSupported;

    if( inputParameters )
    {
        PA_ENSURE( ValidateParameters( inputParameters, hostApi, StreamDirection_In ) );

        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;
    }

    if( outputParameters )
    {
        PA_ENSURE( ValidateParameters( outputParameters, hostApi, StreamDirection_Out ) );

        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
    }

    if( inputChannelCount )
    {
        if( ( result = TestParameters( hostApi, inputParameters, sampleRate, StreamDirection_In ) )
                != paNoError )
            goto error;
    }
    if ( outputChannelCount )
    {
        if( ( result = TestParameters( hostApi, outputParameters, sampleRate, StreamDirection_Out ) )
                != paNoError )
            goto error;
    }

    return paFormatIsSupported;

error:
    return result;
}